

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLhandler.c
# Opt level: O2

RDL_cycleIterator *
RDL_initCycleIterator
          (RDL_IteratorType itype,uint rcf_index,uint rcf_index_max,uint urf_index,
          uint urf_index_max,uint bcc_index,uint bcc_index_max,char mode,RDL_data *data)

{
  RDL_URFinfo **ppRVar1;
  RDL_URFinfo *pRVar2;
  uint *puVar3;
  RDL_cycleIterator *it;
  RDL_cycleIterator *pRVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  
  uVar7 = (ulong)bcc_index;
  it = (RDL_cycleIterator *)malloc(0x50);
  it->mode = mode;
  it->end = '\0';
  it->it1 = (RDL_pathIterator *)0x0;
  it->it2 = (RDL_pathIterator *)0x0;
  it->data = data;
  it->compressed_cycle = (uchar *)0x0;
  if (data->bccGraphs->nof_bcc == 0) {
    it->end = '\x01';
    return it;
  }
  RDL_bitset_init(&it->compressed_cycle,(&data->bccGraphs->bcc_graphs[uVar7]->V)[mode != 'a']);
  it->bcc_index = bcc_index;
  it->bcc_index_max = bcc_index_max;
  ppRVar1 = data->urfInfoPerBCC;
  pRVar2 = ppRVar1[uVar7];
  if (itype < RDL_ALL_IT) {
    it->urf_index = urf_index;
    it->urf_index_max = urf_index_max;
    uVar5 = urf_index;
    if (itype == RDL_RCF_IT) {
      it->rcf_index = rcf_index;
      goto LAB_0010c26d;
    }
  }
  else {
    it->urf_index = 0;
    it->urf_index_max = data->nofURFsPerBCC[uVar7] - 1;
    uVar5 = 0;
  }
  it->rcf_index = 0;
  rcf_index_max = pRVar2->nofCFsPerURF[uVar5] - 1;
LAB_0010c26d:
  it->rcf_index_max = rcf_index_max;
  it->type = itype;
  it->running_rcf = 0;
  it->running_urf = 0;
  uVar5 = 0;
  uVar6 = 0;
  for (uVar8 = 0; uVar8 != uVar7; uVar8 = uVar8 + 1) {
    puVar3 = data->nofURFsPerBCC;
    for (uVar9 = 0; uVar9 < puVar3[uVar8]; uVar9 = uVar9 + 1) {
      uVar5 = uVar5 + ppRVar1[uVar8]->nofCFsPerURF[uVar9];
      it->running_rcf = uVar5;
    }
    uVar6 = uVar6 + puVar3[uVar8];
    it->running_urf = uVar6;
  }
  it->running_urf = uVar6 + urf_index;
  for (uVar7 = 0; urf_index != uVar7; uVar7 = uVar7 + 1) {
    uVar5 = uVar5 + pRVar2->nofCFsPerURF[uVar7];
    it->running_rcf = uVar5;
  }
  it->running_rcf = uVar5 + rcf_index;
  pRVar4 = RDL_cycleIteratorNext(it);
  if (pRVar4 != (RDL_cycleIterator *)0x0) {
    return it;
  }
  (*RDL_outputFunc)(RDL_ERROR,"Iterator initialization failed!\n");
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/rareylab[P]RingDecomposerLib/src/RingDecomposerLib/RDLhandler.c"
                ,0x28a,
                "RDL_cycleIterator *RDL_initCycleIterator(RDL_IteratorType, unsigned int, unsigned int, unsigned int, unsigned int, unsigned int, unsigned int, char, const RDL_data *)"
               );
}

Assistant:

RDL_cycleIterator* RDL_initCycleIterator(
    RDL_IteratorType itype,
    unsigned rcf_index,
    unsigned rcf_index_max,
    unsigned urf_index,
    unsigned urf_index_max,
    unsigned bcc_index,
    unsigned bcc_index_max,
    char mode,
    const RDL_data* data)
{
  unsigned i, j, number;
  RDL_cycleIterator *it;
  const RDL_URFinfo *uInfo;

  it = malloc(sizeof(*it));

  it->mode = mode;
  it->it1 = NULL;
  it->it2 = NULL;
  it->end = 0;
  it->data = data;
  it->compressed_cycle = NULL;

  /* stop right here, if there is nothing to iterate */
  if (it->data->bccGraphs->nof_bcc == 0) {
    it->end = 1;
    return it;
  }
  if (it->mode == 'a') {
    number = it->data->bccGraphs->bcc_graphs[bcc_index]->V;
  }
  else {
    number = it->data->bccGraphs->bcc_graphs[bcc_index]->E;
  }
  RDL_bitset_init(&it->compressed_cycle, number);

  it->bcc_index = bcc_index;
  it->bcc_index_max = bcc_index_max;

  uInfo = data->urfInfoPerBCC[bcc_index];

  if (itype == RDL_URF_IT || itype == RDL_RCF_IT) {
    it->urf_index = urf_index;
    it->urf_index_max = urf_index_max;
  }
  else {
    it->urf_index = 0;
    it->urf_index_max = data->nofURFsPerBCC[it->bcc_index] - 1;
  }

  if (itype == RDL_RCF_IT) {
    it->rcf_index = rcf_index;
    it->rcf_index_max = rcf_index_max;
  }
  else {
    it->rcf_index = 0;
    it->rcf_index_max = uInfo->nofCFsPerURF[it->urf_index] - 1;
  }

  it->type = itype;
  it->running_rcf = 0;
  it->running_urf = 0;

  for(i = 0; i < bcc_index; ++i) {
    for(j = 0; j < data->nofURFsPerBCC[i]; ++j) {
      it->running_rcf += data->urfInfoPerBCC[i]->nofCFsPerURF[j];
    }
    it->running_urf += data->nofURFsPerBCC[i];
  }
  it->running_urf += urf_index;

  for(i = 0; i < urf_index; ++i) {
    it->running_rcf += data->urfInfoPerBCC[bcc_index]->nofCFsPerURF[i];
  }
  it->running_rcf += rcf_index;

  if (!RDL_cycleIteratorNext(it)) {
    RDL_outputFunc(RDL_ERROR, "Iterator initialization failed!\n");
    assert(0);
    return NULL;
  }

  return it;
}